

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

size_t __thiscall cxxopts::ParseResult::count(ParseResult *this,string *o)

{
  bool bVar1;
  pointer pvVar2;
  pointer pvVar3;
  _Node_iterator_base<std::pair<const_unsigned_long,_cxxopts::OptionValue>,_false> local_40;
  _Node_iterator_base<std::pair<const_unsigned_long,_cxxopts::OptionValue>,_false> local_38;
  const_iterator viter;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_28;
  const_iterator iter;
  string *o_local;
  ParseResult *this_local;
  
  iter.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
               )o;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::find(&this->m_keys,o);
  viter.super__Node_iterator_base<std::pair<const_unsigned_long,_cxxopts::OptionValue>,_false>.
  _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_cxxopts::OptionValue>,_false>)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::end(&this->m_keys);
  bVar1 = std::__detail::operator==
                    (&local_28,
                     (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                      *)&viter);
  if (bVar1) {
    this_local = (ParseResult *)0x0;
  }
  else {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
                           *)&local_28);
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_cxxopts::OptionValue,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>_>
         ::find(&this->m_values,&pvVar2->second);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_cxxopts::OptionValue,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>_>
         ::end(&this->m_values);
    bVar1 = std::__detail::operator==(&local_38,&local_40);
    if (bVar1) {
      this_local = (ParseResult *)0x0;
    }
    else {
      pvVar3 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_long,_cxxopts::OptionValue>,_false,_false>
               ::operator->((_Node_const_iterator<std::pair<const_unsigned_long,_cxxopts::OptionValue>,_false,_false>
                             *)&local_38);
      this_local = (ParseResult *)OptionValue::count(&pvVar3->second);
    }
  }
  return (size_t)this_local;
}

Assistant:

size_t
  count(const std::string& o) const
  {
    auto iter = m_keys.find(o);
    if (iter == m_keys.end())
    {
      return 0;
    }

    auto viter = m_values.find(iter->second);

    if (viter == m_values.end())
    {
      return 0;
    }

    return viter->second.count();
  }